

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O1

void __thiscall
pbrt::SceneRepresentation::ErrorExitDeferred<std::__cxx11::string&>
          (SceneRepresentation *this,FileLoc *loc,char *fmt,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  string ret;
  string local_30;
  
  this->errorExit = true;
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  detail::stringPrintfRecursive<std::__cxx11::string&>(&local_30,fmt,args);
  Error(loc,local_30._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,
                    CONCAT71(local_30.field_2._M_allocated_capacity._1_7_,
                             local_30.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void ErrorExitDeferred(const FileLoc *loc, const char *fmt, Args &&... args) const {
        errorExit = true;
        Error(loc, fmt, std::forward<Args>(args)...);
    }